

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrCnf.c
# Opt level: O1

sat_solver * Pdr_ManNewSolver(sat_solver *pSat,Pdr_Man_t *p,int k,int fInit)

{
  Aig_Obj_t *pObj;
  int *piVar1;
  Pdr_Par_t *pPVar2;
  uint uVar3;
  Cnf_Dat_t *pCVar4;
  Vec_Int_t *pVVar5;
  int *piVar6;
  void **ppvVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  Aig_Man_t *pAVar13;
  
  if (pSat == (sat_solver *)0x0) {
    __assert_fail("pSat != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                  ,0x1b9,"sat_solver *Pdr_ManNewSolver(sat_solver *, Pdr_Man_t *, int, int)");
  }
  if (p->pPars->fMonoCnf != 0) {
    if (p->pCnf1 == (Cnf_Dat_t *)0x0) {
      pAVar13 = p->pAig;
      iVar11 = pAVar13->nRegs;
      iVar9 = pAVar13->nObjs[3];
      pAVar13->nRegs = iVar9;
      pCVar4 = Cnf_DeriveWithMan(p->pCnfMan,pAVar13,iVar9);
      p->pCnf1 = pCVar4;
      pAVar13 = p->pAig;
      pAVar13->nRegs = iVar11;
      if (p->vVar2Reg != (Vec_Int_t *)0x0) {
        __assert_fail("p->vVar2Reg == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                      ,0x16e,"sat_solver *Pdr_ManNewSolver1(sat_solver *, Pdr_Man_t *, int, int)");
      }
      iVar11 = pCVar4->nVars;
      pVVar5 = (Vec_Int_t *)malloc(0x10);
      iVar9 = 0x10;
      if (0xe < iVar11 - 1U) {
        iVar9 = iVar11;
      }
      pVVar5->nSize = 0;
      pVVar5->nCap = iVar9;
      if (iVar9 == 0) {
        piVar6 = (int *)0x0;
      }
      else {
        piVar6 = (int *)malloc((long)iVar9 << 2);
      }
      pVVar5->pArray = piVar6;
      pVVar5->nSize = iVar11;
      if (piVar6 != (int *)0x0) {
        memset(piVar6,0xff,(long)iVar11 << 2);
      }
      p->vVar2Reg = pVVar5;
      if (0 < pAVar13->nRegs) {
        iVar11 = 0;
        do {
          uVar3 = pAVar13->nTruePos + iVar11;
          if (((int)uVar3 < 0) || (pAVar13->vCos->nSize <= (int)uVar3)) goto LAB_008c24b0;
          pObj = (Aig_Obj_t *)pAVar13->vCos->pArray[uVar3];
          pVVar5 = p->vVar2Reg;
          if (p->pPars->fMonoCnf == 0) {
            uVar3 = Pdr_ObjSatVar2(p,k,pObj,0,3);
          }
          else {
            uVar3 = p->pCnf1->pVarNums[pObj->Id];
          }
          if (((int)uVar3 < 0) || (pVVar5->nSize <= (int)uVar3)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                          ,0x1c9,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
          }
          pVVar5->pArray[uVar3] = iVar11;
          iVar11 = iVar11 + 1;
          pAVar13 = p->pAig;
        } while (iVar11 < pAVar13->nRegs);
      }
    }
    pSat = (sat_solver *)Cnf_DataWriteIntoSolverInt(pSat,p->pCnf1,1,fInit);
    goto LAB_008c2472;
  }
  if (p->pCnf2 == (Cnf_Dat_t *)0x0) {
    pCVar4 = Cnf_DeriveOtherWithMan(p->pCnfMan,p->pAig,0);
    p->pCnf2 = pCVar4;
    pVVar5 = (Vec_Int_t *)calloc((long)p->pAig->vObjs->nSize,0x10);
    p->pvId2Vars = pVVar5;
    if ((p->vVar2Ids).nCap < 0x100) {
      ppvVar7 = (p->vVar2Ids).pArray;
      if (ppvVar7 == (void **)0x0) {
        ppvVar7 = (void **)malloc(0x800);
      }
      else {
        ppvVar7 = (void **)realloc(ppvVar7,0x800);
      }
      (p->vVar2Ids).pArray = ppvVar7;
      (p->vVar2Ids).nCap = 0x100;
    }
  }
  if ((p->vVar2Ids).nSize <= k) {
    iVar11 = k + 1;
    iVar9 = (p->vVar2Ids).nCap;
    iVar12 = iVar9 * 2;
    if (k < iVar12) {
      if (iVar9 < iVar12 && iVar9 <= k) {
        ppvVar7 = (p->vVar2Ids).pArray;
        if (ppvVar7 == (void **)0x0) {
          ppvVar7 = (void **)malloc((long)iVar9 << 4);
        }
        else {
          ppvVar7 = (void **)realloc(ppvVar7,(long)iVar9 << 4);
        }
        (p->vVar2Ids).pArray = ppvVar7;
LAB_008c2389:
        (p->vVar2Ids).nCap = iVar12;
      }
    }
    else if (iVar9 <= k) {
      ppvVar7 = (p->vVar2Ids).pArray;
      if (ppvVar7 == (void **)0x0) {
        ppvVar7 = (void **)malloc((long)iVar11 << 3);
      }
      else {
        ppvVar7 = (void **)realloc(ppvVar7,(long)iVar11 << 3);
      }
      (p->vVar2Ids).pArray = ppvVar7;
      iVar12 = iVar11;
      goto LAB_008c2389;
    }
    iVar9 = (p->vVar2Ids).nSize;
    lVar8 = (long)iVar9;
    if (iVar9 <= k) {
      do {
        (p->vVar2Ids).pArray[lVar8] = (void *)0x0;
        lVar8 = lVar8 + 1;
      } while (iVar11 != lVar8);
    }
    (p->vVar2Ids).nSize = iVar11;
  }
  if ((k < 0) || ((p->vVar2Ids).nSize <= k)) {
LAB_008c24b0:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  ppvVar7 = (p->vVar2Ids).pArray;
  pVVar5 = (Vec_Int_t *)ppvVar7[(uint)k];
  if (pVVar5 == (Vec_Int_t *)0x0) {
    pVVar5 = (Vec_Int_t *)malloc(0x10);
    pVVar5->nCap = 500;
    pVVar5->nSize = 0;
    piVar6 = (int *)malloc(2000);
    pVVar5->pArray = piVar6;
    ppvVar7[(uint)k] = pVVar5;
  }
  if (0 < pVVar5->nSize) {
    piVar6 = pVVar5->pArray;
    lVar8 = 0;
    do {
      lVar10 = (long)piVar6[lVar8];
      if (lVar10 != -1) {
        if (p->pvId2Vars[lVar10].nSize <= k) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                        ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        piVar1 = p->pvId2Vars[lVar10].pArray;
        if (piVar1[(uint)k] < 1) {
          __assert_fail("Vec_IntEntry( p->pvId2Vars + Entry, k ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/proof/pdr/pdrCnf.c"
                        ,0x19e,"sat_solver *Pdr_ManNewSolver2(sat_solver *, Pdr_Man_t *, int, int)")
          ;
        }
        piVar1[(uint)k] = 0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < pVVar5->nSize);
  }
  pVVar5->nSize = 0;
  Vec_IntPush(pVVar5,-1);
  sat_solver_setnvars(pSat,500);
LAB_008c2472:
  pSat->nRuntimeLimit = p->timeToStop;
  pPVar2 = p->pPars;
  pSat->RunId = pPVar2->RunId;
  pSat->pFuncStop = pPVar2->pFuncStop;
  return pSat;
}

Assistant:

sat_solver * Pdr_ManNewSolver( sat_solver * pSat, Pdr_Man_t * p, int k, int fInit )
{
    assert( pSat != NULL );
    if ( p->pPars->fMonoCnf )
        return Pdr_ManNewSolver1( pSat, p, k, fInit );
    else
        return Pdr_ManNewSolver2( pSat, p, k, fInit );
}